

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_interpretSend
          (sysbvm_context_t *context,sysbvm_tuple_t receiverType,sysbvm_tuple_t selector,
          size_t argumentCount,sysbvm_tuple_t *receiverAndArguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t message;
  size_t i;
  sysbvm_tuple_t arguments;
  sysbvm_tuple_t method;
  sysbvm_tuple_t *receiverAndArguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t selector_local;
  sysbvm_tuple_t receiverType_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_type_lookupSelector(context,receiverType,selector);
  if (sVar1 == 0) {
    arguments = 0;
    if (selector != (context->roots).doesNotUnderstandSelector) {
      arguments = sysbvm_type_lookupSelector(context,receiverType,selector);
    }
    if (arguments == 0) {
      sysbvm_error("Message not understood");
    }
    sVar1 = sysbvm_array_create(context,argumentCount);
    for (message = 0; message < argumentCount; message = message + 1) {
      sysbvm_array_atPut(sVar1,message,receiverAndArguments[message + 1]);
    }
    sVar1 = sysbvm_message_create(context,selector,sVar1,receiverType,0);
    context_local =
         (sysbvm_context_t *)sysbvm_function_apply2(context,arguments,*receiverAndArguments,sVar1);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_bytecodeInterpreter_functionApply
                   (context,sVar1,argumentCount + 1,receiverAndArguments,0);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_bytecodeInterpreter_interpretSend(sysbvm_context_t *context, sysbvm_tuple_t receiverType, sysbvm_tuple_t selector, size_t argumentCount, sysbvm_tuple_t *receiverAndArguments)
{
    sysbvm_tuple_t method = sysbvm_type_lookupSelector(context, receiverType, selector);
    if(method)
        return sysbvm_bytecodeInterpreter_functionApply(context, method, argumentCount + 1, receiverAndArguments, 0);

    // Attempt to send doesNotUnderstand:
    if(selector != context->roots.doesNotUnderstandSelector)
        method = sysbvm_type_lookupSelector(context, receiverType, selector);
    if(!method)
        sysbvm_error("Message not understood");

    // Make the message.
    sysbvm_tuple_t arguments = sysbvm_array_create(context, argumentCount);
    for(size_t i = 0; i < argumentCount; ++i)
        sysbvm_array_atPut(arguments, i, receiverAndArguments[1 + i]);

    sysbvm_tuple_t message = sysbvm_message_create(context, selector, arguments, receiverType, SYSBVM_NULL_TUPLE);
    return sysbvm_function_apply2(context, method, receiverAndArguments[0], message);
}